

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddImportedGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *gt_local;
  cmLocalGenerator *this_local;
  
  local_18 = gt;
  gt_local = (cmGeneratorTarget *)this;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
            (&this->ImportedGeneratorTargets,&local_18);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_18);
  return;
}

Assistant:

void cmLocalGenerator::AddImportedGeneratorTarget(cmGeneratorTarget* gt)
{
  this->ImportedGeneratorTargets.push_back(gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}